

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O0

void __thiscall lunasvg::SVGElement::setAttributes(SVGElement *this,AttributeList *attributes)

{
  bool bVar1;
  reference attribute_00;
  Attribute *attribute;
  const_iterator __end1;
  const_iterator __begin1;
  AttributeList *__range1;
  AttributeList *attributes_local;
  SVGElement *this_local;
  
  __end1 = std::forward_list<lunasvg::Attribute,_std::allocator<lunasvg::Attribute>_>::begin
                     (attributes);
  attribute = (Attribute *)
              std::forward_list<lunasvg::Attribute,_std::allocator<lunasvg::Attribute>_>::end
                        (attributes);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&attribute);
    if (!bVar1) break;
    attribute_00 = std::_Fwd_list_const_iterator<lunasvg::Attribute>::operator*(&__end1);
    setAttribute(this,attribute_00);
    std::_Fwd_list_const_iterator<lunasvg::Attribute>::operator++(&__end1);
  }
  return;
}

Assistant:

void SVGElement::setAttributes(const AttributeList& attributes)
{
    for(const auto& attribute : attributes) {
        setAttribute(attribute);
    }
}